

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

Aig_RMan_t * Aig_RManStart(void)

{
  int iVar1;
  Aig_RMan_t *__s;
  Aig_Man_t *pAVar2;
  Aig_Tru_t **ppAVar3;
  Aig_MmFlex_t *pAVar4;
  Bdc_Man_t *pBVar5;
  Aig_RMan_t *p;
  
  __s = (Aig_RMan_t *)malloc(0xd78);
  memset(__s,0,0xd78);
  __s->nVars = 0xc;
  pAVar2 = Aig_ManStart(1000000);
  __s->pAig = pAVar2;
  Aig_IthVar(__s->pAig,__s->nVars + -1);
  iVar1 = Abc_PrimeCudd(5000);
  __s->nBins = iVar1;
  ppAVar3 = (Aig_Tru_t **)calloc((long)__s->nBins,8);
  __s->pBins = ppAVar3;
  pAVar4 = Aig_MmFlexStart();
  __s->pMemTrus = pAVar4;
  Aig_RManStart::pPars->nVarsMax = __s->nVars;
  Aig_RManStart::pPars->fVerbose = 0;
  pBVar5 = Bdc_ManAlloc(Aig_RManStart::pPars);
  __s->pBidec = pBVar5;
  return __s;
}

Assistant:

Aig_RMan_t * Aig_RManStart()
{
    static Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Aig_RMan_t * p;
    p = ABC_ALLOC( Aig_RMan_t, 1 );
    memset( p, 0, sizeof(Aig_RMan_t) );
    p->nVars = RMAN_MAXVARS;
    p->pAig  = Aig_ManStart( 1000000 );
    Aig_IthVar( p->pAig, p->nVars-1 );
    // create hash table
    p->nBins = Abc_PrimeCudd(5000);
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    p->pMemTrus = Aig_MmFlexStart();
    // bi-decomposition manager
    pPars->nVarsMax = p->nVars;
    pPars->fVerbose = 0;
    p->pBidec = Bdc_ManAlloc( pPars );
    return p;
}